

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.cpp
# Opt level: O3

int __thiscall
ANN::NearestNeighbor(ANN *this,int *topology,double *scaling,ANNpoint *x,double *d_best)

{
  int iVar1;
  ANNpoint pAVar2;
  ANNpoint pAVar3;
  long lVar4;
  double dVar5;
  
  iVar1 = this->dimension;
  if ((long)iVar1 < 1) {
    pAVar3 = this->query_pt;
  }
  else {
    pAVar2 = *x;
    pAVar3 = this->query_pt;
    lVar4 = 0;
    do {
      pAVar3[lVar4] = scaling[lVar4] * pAVar2[lVar4];
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  (*(this->the_tree->super_ANNpointSet)._vptr_ANNpointSet[2])
            (this->epsilon,this->the_tree,pAVar3,1,this->nn_idx,this->dists);
  iVar1 = this->node_indices[*this->nn_idx];
  dVar5 = *this->dists;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  *d_best = dVar5;
  return iVar1;
}

Assistant:

int ANN::NearestNeighbor(int *topology, double *scaling, const ANNpoint &x,
                         double &d_best) {
    int i;
    int best_node;  // index of the closest node to x

    // Transfer x to query_pt
    for (i = 0; i < dimension; i++) {
        query_pt[i] = scaling[i] * x[i];
    }

    the_tree->annkSearch(query_pt,  // query point
                         1,         // number of near neighbors
                         nn_idx,    // nearest neighbors (returned)
                         dists,     // distance (returned)
                         epsilon);  // error bound

    best_node = node_indices[nn_idx[0]];
    d_best = sqrt(dists[0]);
    return best_node;
}